

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

int selectOp(int c)

{
  undefined4 local_10;
  int riscOp;
  int c_local;
  
  local_10 = 0;
  if (c == 0x66) {
    local_10 = 0x28;
  }
  else if (c == 0x6a) {
    local_10 = 0x2a;
  }
  else if (c == 0x6b) {
    local_10 = 0x2d;
  }
  else if (c == 0x67) {
    local_10 = 0x2c;
  }
  else if (c == 0x68) {
    local_10 = 0x2b;
  }
  else if (c == 0x69) {
    local_10 = 0x29;
  }
  return local_10;
}

Assistant:

procedure
int selectOp(int c) {
	variable int riscOp;
	riscOp=0;
	if (c == SYMBOL_EQUALTEST) {
		riscOp = RISC_BEQ;
	} elsif (c == SYMBOL_LESS) {
		riscOp = RISC_BLT;
	} elsif (c == SYMBOL_GREATER) {
		riscOp = RISC_BGT;
	} elsif (c == SYMBOL_LEQ) {
		riscOp = RISC_BLE;
	} elsif (c == SYMBOL_GEQ) {
		riscOp = RISC_BGE;
	} elsif (c == SYMBOL_NOT) {
		riscOp = RISC_BNE;
	}
	return riscOp;
}